

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::~IfcOrientedEdge(IfcOrientedEdge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x90f668;
  *(undefined8 *)&this->field_0x78 = 0x90f708;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x90f690;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x90f6b8;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x90f6e0;
  pcVar2 = (this->Orientation)._M_dataplus._M_p;
  paVar1 = &(this->Orientation).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x90);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}